

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::Decode(IFF_Layer2 *this,KDataStream *stream,bool ignoreHeader)

{
  SecondaryOperationalData *this_00;
  pointer pIVar1;
  pointer pIVar2;
  bool bVar3;
  KUINT16 KVar4;
  KException *this_01;
  ushort uVar5;
  pointer pIVar6;
  IFF_ATC_NAVAIDS_FundamentalParameterData local_58;
  
  KVar4 = KDataStream::GetBufferSize(stream);
  if (KVar4 < 0x1c) {
    this_01 = (KException *)__cxa_allocate_exception(0x30);
    local_58.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_58.m_f32PgRF;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_01,(KString *)&local_58,2);
    __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
  }
  pIVar1 = (this->m_vFPD).
           super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->m_vFPD).
           super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar6 = pIVar1;
  if (pIVar2 != pIVar1) {
    do {
      (**(pIVar6->super_DataTypeBase)._vptr_DataTypeBase)(pIVar6);
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar2);
    (this->m_vFPD).
    super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  if (!ignoreHeader) {
    LayerHeader::Decode(&this->super_LayerHeader,stream);
  }
  (*(this->m_BmDt).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_BmDt,stream);
  this_00 = &this->m_SOD;
  (*(this->m_SOD).super_DataTypeBase._vptr_DataTypeBase[3])(this_00,stream);
  KVar4 = SecondaryOperationalData::GetNumberOfFundamentalParamSets(this_00);
  if (KVar4 != 0) {
    uVar5 = 1;
    do {
      IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData
                (&local_58,stream);
      std::
      vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
      ::emplace_back<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>
                (&this->m_vFPD,&local_58);
      IFF_ATC_NAVAIDS_FundamentalParameterData::~IFF_ATC_NAVAIDS_FundamentalParameterData(&local_58)
      ;
      KVar4 = SecondaryOperationalData::GetNumberOfFundamentalParamSets(this_00);
      bVar3 = uVar5 < KVar4;
      uVar5 = (ushort)(byte)((char)uVar5 + 1);
    } while (bVar3);
  }
  return;
}

Assistant:

void IFF_Layer2::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_LAYER2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vFPD.clear();

	if( !ignoreHeader )
	{
		LayerHeader::Decode( stream );
	}

    stream >> KDIS_STREAM m_BmDt
           >> KDIS_STREAM m_SOD;

    for( KUINT8 i = 0; i < m_SOD.GetNumberOfFundamentalParamSets(); ++i )
    {
        m_vFPD.push_back( IFF_ATC_NAVAIDS_FundamentalParameterData( stream ) );
    }
}